

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestPackedExtensionsLite::~TestPackedExtensionsLite(TestPackedExtensionsLite *this)

{
  TestPackedExtensionsLite *this_local;
  
  SharedDtor(&this->super_MessageLite);
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

TestPackedExtensionsLite::~TestPackedExtensionsLite() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestPackedExtensionsLite)
  SharedDtor(*this);
}